

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O0

string * __thiscall phosg::MD5::hex_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  MD5 *this_local;
  
  uVar1 = bswap32(this->a0);
  uVar2 = bswap32(this->b0);
  uVar3 = bswap32(this->c0);
  uVar4 = bswap32(this->d0);
  string_printf_abi_cxx11_
            (__return_storage_ptr__,"%08X%08X%08X%08X",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
             (ulong)uVar4);
  return __return_storage_ptr__;
}

Assistant:

string MD5::hex() const {
  return phosg::string_printf("%08" PRIX32 "%08" PRIX32 "%08" PRIX32 "%08" PRIX32,
      bswap32(this->a0), bswap32(this->b0), bswap32(this->c0), bswap32(this->d0));
}